

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

int __thiscall QFileDialogPrivate::init(QFileDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  QWidget *this_00;
  QPlatformFileDialogHelper *pQVar2;
  ulong uVar3;
  char *str;
  long in_FS_OFFSET;
  QFileDialog *q;
  QSize sizeHint;
  QSettings settings;
  QFileDialogPrivate *in_stack_000003f0;
  undefined1 *len;
  QString *in_stack_ffffffffffffff28;
  QWidget *in_stack_ffffffffffffff30;
  QFileDialogPrivate *s;
  char *in_stack_ffffffffffffff58;
  QFileDialog *in_stack_ffffffffffffff60;
  undefined1 local_90 [40];
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  QVariant local_28;
  QFileDialogPrivate *this_01;
  
  this_01 = *(QFileDialogPrivate **)(in_FS_OFFSET + 0x28);
  s = this;
  this_00 = (QWidget *)q_func(this);
  bVar1 = QString::isEmpty((QString *)0x74cd68);
  if (!bVar1) {
    this->useDefaultCaption = false;
    QString::operator=(&this->setWindowTitle,(QString *)(ctx + 8));
    QWidget::setWindowTitle(this_00,(QString *)this);
  }
  QFileDialog::setAcceptMode((QFileDialog *)this_00,(AcceptMode)((ulong)this >> 0x20));
  pQVar2 = platformFileDialogHelper((QFileDialogPrivate *)0x74cdb6);
  (this->super_QDialogPrivate).nativeDialogInUse = pQVar2 != (QPlatformFileDialogHelper *)0x0;
  if (((this->super_QDialogPrivate).nativeDialogInUse & 1U) == 0) {
    createWidgets(in_stack_000003f0);
  }
  QFileDialog::setFileMode
            (in_stack_ffffffffffffff60,(FileMode)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  bVar1 = QString::isEmpty((QString *)0x74cdfb);
  if (!bVar1) {
    QFileDialog::setNameFilter((QFileDialog *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  QFileDialog::setDirectoryUrl
            ((QFileDialog *)in_stack_ffffffffffffff30,(QUrl *)in_stack_ffffffffffffff28);
  uVar3 = QUrl::isLocalFile();
  if ((uVar3 & 1) == 0) {
    QFileDialog::selectUrl
              ((QFileDialog *)in_stack_ffffffffffffff30,(QUrl *)in_stack_ffffffffffffff28);
  }
  else {
    QFileDialog::selectFile((QFileDialog *)in_stack_ffffffffffffff58,(QString *)s);
  }
  bVar1 = restoreFromSettings(this_01);
  if (!bVar1) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____s((char16_t *)this,(size_t)in_stack_ffffffffffffff30);
    QString::QString((QString *)0x74ceb7);
    QSettings::QSettings
              ((QSettings *)&local_38,UserScope,(QString *)local_50,(QString *)local_68,
               (QObject *)0x0);
    QString::~QString((QString *)0x74cee8);
    in_stack_ffffffffffffff30 = this_00;
    QString::~QString((QString *)0x74cef5);
    len = local_90;
    in_stack_ffffffffffffff58 = "Qt/filedialog";
    this_00 = in_stack_ffffffffffffff30;
    str = std::data<char_const,14ul>((char (*) [14])"Qt/filedialog");
    QtPrivate::lengthHelperContainer<char,14ul>((char (*) [14])0x74cf38);
    QAnyStringView::QAnyStringView<char,_true>
              ((QAnyStringView *)in_stack_ffffffffffffff30,str,(qsizetype)len);
    QSettings::value((QAnyStringView *)&local_28);
    ::QVariant::toByteArray();
    QFileDialog::restoreState((QFileDialog *)this_00,(QByteArray *)this);
    QByteArray::~QByteArray((QByteArray *)0x74cf94);
    ::QVariant::~QVariant(&local_28);
    QSettings::~QSettings((QSettings *)&local_38);
  }
  (**(code **)(*(long *)this_00 + 0x70))();
  bVar1 = QSize::isValid((QSize *)in_stack_ffffffffffffff30);
  if (bVar1) {
    QWidget::resize((QWidget *)in_stack_ffffffffffffff58,(QSize *)s);
  }
  if (*(QFileDialogPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return (int)*(QFileDialogPrivate **)(in_FS_OFFSET + 0x28);
}

Assistant:

void QFileDialogPrivate::init(const QFileDialogArgs &args)
{
    Q_Q(QFileDialog);
    if (!args.caption.isEmpty()) {
        useDefaultCaption = false;
        setWindowTitle = args.caption;
        q->setWindowTitle(args.caption);
    }

    q->setAcceptMode(QFileDialog::AcceptOpen);
    nativeDialogInUse = platformFileDialogHelper() != nullptr;
    if (!nativeDialogInUse)
        createWidgets();
    q->setFileMode(QFileDialog::AnyFile);
    if (!args.filter.isEmpty())
        q->setNameFilter(args.filter);
    q->setDirectoryUrl(args.directory);
    if (args.directory.isLocalFile())
        q->selectFile(args.selection);
    else
        q->selectUrl(args.directory);

#if QT_CONFIG(settings)
    // Try to restore from the FileDialog settings group; if it fails, fall back
    // to the pre-5.5 QByteArray serialized settings.
    if (!restoreFromSettings()) {
        const QSettings settings(QSettings::UserScope, u"QtProject"_s);
        q->restoreState(settings.value("Qt/filedialog").toByteArray());
    }
#endif

#if defined(Q_EMBEDDED_SMALLSCREEN)
    qFileDialogUi->lookInLabel->setVisible(false);
    qFileDialogUi->fileNameLabel->setVisible(false);
    qFileDialogUi->fileTypeLabel->setVisible(false);
    qFileDialogUi->sidebar->hide();
#endif

    const QSize sizeHint = q->sizeHint();
    if (sizeHint.isValid())
       q->resize(sizeHint);
}